

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorHelper.cpp
# Opt level: O1

void primesieve::IteratorHelper::next
               (uint64_t *start,uint64_t *stop,uint64_t stopHint,uint64_t *dist)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  undefined1 auVar7 [16];
  
  uVar1 = 0xffffffffffffffff;
  if (*stop + 1 != 0) {
    uVar1 = *stop + 1;
  }
  *start = uVar1;
  uVar1 = PrimeGenerator::maxCachedPrime();
  uVar4 = *start;
  if (uVar4 < uVar1) {
    *stop = uVar1;
    *dist = uVar1 - *start;
  }
  else {
    auVar5._8_4_ = (int)(uVar4 >> 0x20);
    auVar5._0_8_ = uVar4;
    auVar5._12_4_ = 0x45300000;
    uVar1 = *dist;
    dVar6 = (auVar5._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    uVar2 = PrimeGenerator::maxCachedPrime();
    if (dVar6 < 0.0) {
      dVar6 = sqrt(dVar6);
    }
    else {
      dVar6 = SQRT(dVar6);
    }
    uVar3 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    uVar4 = uVar1 << 2;
    if (uVar1 << 2 <= uVar2 << 2) {
      uVar4 = uVar2 << 2;
    }
    if (uVar4 <= uVar3) {
      uVar4 = uVar3;
    }
    if (0xfffffffffffffff < uVar4) {
      uVar4 = 0x1000000000000000;
    }
    *dist = uVar4;
    uVar1 = 0xffffffffffffffff;
    if (!CARRY8(uVar4,*start)) {
      uVar1 = uVar4 + *start;
    }
    *stop = uVar1;
    if ((stopHint != 0xffffffffffffffff) && (*start <= stopHint)) {
      auVar7._8_4_ = (int)(stopHint >> 0x20);
      auVar7._0_8_ = stopHint;
      auVar7._12_4_ = 0x45300000;
      dVar6 = (auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)stopHint) - 4503599627370496.0);
      if (dVar6 <= 8.0) {
        dVar6 = 8.0;
      }
      dVar6 = log(dVar6);
      uVar4 = (ulong)(dVar6 * dVar6);
      uVar4 = (long)(dVar6 * dVar6 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
      uVar1 = 0xffffffffffffffff;
      if (!CARRY8(uVar4,stopHint)) {
        uVar1 = uVar4 + stopHint;
      }
      *stop = uVar1;
    }
  }
  return;
}

Assistant:

void IteratorHelper::next(uint64_t* start,
                          uint64_t* stop,
                          uint64_t stopHint,
                          uint64_t* dist)
{
  *start = checkedAdd(*stop, 1);
  uint64_t maxCachedPrime = PrimeGenerator::maxCachedPrime();

  if (*start < maxCachedPrime)
  {
    // When the stop number <= maxCachedPrime
    // primesieve::iterator uses the primes
    // cache instead of sieving and does not
    // even initialize Erat::init()
    *stop = maxCachedPrime;
    *dist = *stop - *start;
  }
  else
  {
    *dist = getNextDist(*start, *dist);
    *stop = checkedAdd(*start, *dist);

    if (useStopHint(*start, stopHint))
      *stop = checkedAdd(stopHint, maxPrimeGap(stopHint));
  }
}